

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

TokenType __thiscall enact::Lexer::getIdentifierType(Lexer *this,string *candidate)

{
  long *plVar1;
  long lVar2;
  TokenType TVar3;
  const_iterator cVar4;
  iterator iVar5;
  long *extraout_RDX;
  char *pcVar6;
  
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_keywords)._M_h,candidate);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_true>
      ._M_cur == (__node_type *)0x0) {
    TVar3 = IDENTIFIER;
  }
  else {
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_keywords)._M_h,candidate);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar6 = "_Map_base::at";
      std::__throw_out_of_range("_Map_base::at");
      *(int *)&candidate[3]._M_string_length = (int)candidate[3]._M_string_length + 1;
      pcVar6[0] = '&';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      *(char **)(pcVar6 + 8) = pcVar6 + 0x18;
      plVar1 = extraout_RDX + 2;
      if ((long *)*extraout_RDX == plVar1) {
        lVar2 = extraout_RDX[3];
        *(long *)(pcVar6 + 0x18) = *plVar1;
        *(long *)(pcVar6 + 0x20) = lVar2;
      }
      else {
        *(long *)(pcVar6 + 8) = *extraout_RDX;
        *(long *)(pcVar6 + 0x18) = *plVar1;
      }
      *(long *)(pcVar6 + 0x10) = extraout_RDX[1];
      *extraout_RDX = (long)plVar1;
      extraout_RDX[1] = 0;
      *(undefined1 *)(extraout_RDX + 2) = 0;
      *(undefined4 *)(pcVar6 + 0x28) = *(undefined4 *)&candidate[1].field_2;
      *(undefined2 *)(pcVar6 + 0x2c) = *(undefined2 *)((long)&candidate[1].field_2 + 4);
      return (TokenType)pcVar6;
    }
    TVar3 = *(TokenType *)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>,_true>
                    ._M_cur + 0x28);
  }
  return TVar3;
}

Assistant:

TokenType Lexer::getIdentifierType(const std::string& candidate) {
        if (m_keywords.count(candidate) > 0) {
            return m_keywords.at(candidate);
        }

        return TokenType::IDENTIFIER;
    }